

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isadetection.c
# Opt level: O0

uint32_t dynamic_croaring_detect_supported_architectures(void)

{
  uint64_t uVar1;
  uint64_t xcr0;
  uint32_t host_isa;
  uint32_t edx;
  uint32_t ecx;
  uint32_t ebx;
  uint32_t eax;
  uint local_18;
  uint32_t local_14;
  uint32_t local_10;
  uint local_c;
  uint32_t local_8;
  uint local_4;
  
  local_8 = 1;
  local_10 = 0;
  cpuid(&local_8,&local_c,&local_10,&local_14);
  if ((local_10 & dynamic_croaring_detect_supported_architectures::cpuid_sse42_bit) == 0) {
    local_4 = 0;
  }
  else {
    local_18 = 8;
    if ((local_10 & dynamic_croaring_detect_supported_architectures::cpuid_pclmulqdq_bit) != 0) {
      local_18 = 0x18;
    }
    if ((local_10 & dynamic_croaring_detect_supported_architectures::cpuid_osxsave) ==
        dynamic_croaring_detect_supported_architectures::cpuid_osxsave) {
      uVar1 = xgetbv();
      if ((uVar1 & dynamic_croaring_detect_supported_architectures::cpuid_avx256_saved) == 0) {
        local_4 = local_18;
      }
      else {
        local_8 = 7;
        local_10 = 0;
        cpuid(&local_8,&local_c,&local_10,&local_14);
        if ((local_c & dynamic_croaring_detect_supported_architectures::cpuid_avx2_bit) != 0) {
          local_18 = local_18 | 4;
        }
        if ((local_c & dynamic_croaring_detect_supported_architectures::cpuid_bmi1_bit) != 0) {
          local_18 = local_18 | 0x20;
        }
        if ((local_c & dynamic_croaring_detect_supported_architectures::cpuid_bmi2_bit) != 0) {
          local_18 = local_18 | 0x40;
        }
        if ((uVar1 & dynamic_croaring_detect_supported_architectures::cpuid_avx512_saved) ==
            dynamic_croaring_detect_supported_architectures::cpuid_avx512_saved) {
          if ((local_c & dynamic_croaring_detect_supported_architectures::cpuid_avx512f_bit) != 0) {
            local_18 = local_18 | 0x100;
          }
          if ((local_c & dynamic_croaring_detect_supported_architectures::cpuid_avx512bw_bit) != 0)
          {
            local_18 = local_18 | 0x400;
          }
          if ((local_c & dynamic_croaring_detect_supported_architectures::cpuid_avx512dq_bit) != 0)
          {
            local_18 = local_18 | 0x200;
          }
          if ((local_10 & dynamic_croaring_detect_supported_architectures::cpuid_avx512vbmi2_bit) !=
              0) {
            local_18 = local_18 | 0x800;
          }
          if ((local_10 & dynamic_croaring_detect_supported_architectures::cpuid_avx512bitalg_bit)
              != 0) {
            local_18 = local_18 | 0x1000;
          }
          if ((local_10 & dynamic_croaring_detect_supported_architectures::cpuid_avx512vpopcntdq_bit
              ) != 0) {
            local_18 = local_18 | 0x2000;
          }
          local_4 = local_18;
        }
        else {
          local_4 = local_18;
        }
      }
    }
    else {
      local_4 = local_18;
    }
  }
  return local_4;
}

Assistant:

static inline uint32_t dynamic_croaring_detect_supported_architectures(void) {
    uint32_t eax, ebx, ecx, edx;
    uint32_t host_isa = 0x0;
    // Can be found on Intel ISA Reference for CPUID
    static uint32_t cpuid_avx2_bit =
        1 << 5;  ///< @private Bit 5 of EBX for EAX=0x7
    static uint32_t cpuid_bmi1_bit =
        1 << 3;  ///< @private bit 3 of EBX for EAX=0x7
    static uint32_t cpuid_bmi2_bit =
        1 << 8;  ///< @private bit 8 of EBX for EAX=0x7
    static uint32_t cpuid_avx512f_bit =
        1 << 16;  ///< @private bit 16 of EBX for EAX=0x7
    static uint32_t cpuid_avx512dq_bit =
        1 << 17;  ///< @private bit 17 of EBX for EAX=0x7
    static uint32_t cpuid_avx512bw_bit =
        1 << 30;  ///< @private bit 30 of EBX for EAX=0x7
    static uint32_t cpuid_avx512vbmi2_bit =
        1 << 6;  ///< @private bit 6 of ECX for EAX=0x7
    static uint32_t cpuid_avx512bitalg_bit =
        1 << 12;  ///< @private bit 12 of ECX for EAX=0x7
    static uint32_t cpuid_avx512vpopcntdq_bit =
        1 << 14;  ///< @private bit 14 of ECX for EAX=0x7
    static uint64_t cpuid_avx256_saved = 1 << 2;  ///< @private bit 2 = AVX
    static uint64_t cpuid_avx512_saved =
        7 << 5;  ///< @private bits 5,6,7 = opmask, ZMM_hi256, hi16_ZMM
    static uint32_t cpuid_sse42_bit =
        1 << 20;  ///< @private bit 20 of ECX for EAX=0x1
    static uint32_t cpuid_osxsave =
        (1 << 26) | (1 << 27);  ///< @private bits 26+27 of ECX for EAX=0x1
    static uint32_t cpuid_pclmulqdq_bit =
        1 << 1;  ///< @private bit  1 of ECX for EAX=0x1

    // EBX for EAX=0x1
    eax = 0x1;
    ecx = 0x0;
    cpuid(&eax, &ebx, &ecx, &edx);

    if (ecx & cpuid_sse42_bit) {
        host_isa |= CROARING_SSE42;
    } else {
        return host_isa;  // everything after is redundant
    }

    if (ecx & cpuid_pclmulqdq_bit) {
        host_isa |= CROARING_PCLMULQDQ;
    }

    if ((ecx & cpuid_osxsave) != cpuid_osxsave) {
        return host_isa;
    }

    // xgetbv for checking if the OS saves registers
    uint64_t xcr0 = xgetbv();

    if ((xcr0 & cpuid_avx256_saved) == 0) {
        return host_isa;
    }

    // ECX for EAX=0x7
    eax = 0x7;
    ecx = 0x0;
    cpuid(&eax, &ebx, &ecx, &edx);
    if (ebx & cpuid_avx2_bit) {
        host_isa |= CROARING_AVX2;
    }
    if (ebx & cpuid_bmi1_bit) {
        host_isa |= CROARING_BMI1;
    }

    if (ebx & cpuid_bmi2_bit) {
        host_isa |= CROARING_BMI2;
    }

    if (!((xcr0 & cpuid_avx512_saved) == cpuid_avx512_saved)) {
        return host_isa;
    }

    if (ebx & cpuid_avx512f_bit) {
        host_isa |= CROARING_AVX512F;
    }

    if (ebx & cpuid_avx512bw_bit) {
        host_isa |= CROARING_AVX512BW;
    }

    if (ebx & cpuid_avx512dq_bit) {
        host_isa |= CROARING_AVX512DQ;
    }

    if (ecx & cpuid_avx512vbmi2_bit) {
        host_isa |= CROARING_AVX512VBMI2;
    }

    if (ecx & cpuid_avx512bitalg_bit) {
        host_isa |= CROARING_AVX512BITALG;
    }

    if (ecx & cpuid_avx512vpopcntdq_bit) {
        host_isa |= CROARING_AVX512VPOPCNTDQ;
    }

    return host_isa;
}